

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

bool __thiscall Catch::AssertionResult::hasExpandedExpression(AssertionResult *this)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((this->m_info).capturedExpression._M_string_length == 0) {
    bVar1 = false;
  }
  else {
    std::__cxx11::string::string((string *)&bStack_58,(string *)&this->m_resultData);
    std::__cxx11::string::string((string *)&local_38,(string *)&(this->m_info).capturedExpression);
    bVar1 = std::operator!=(&bStack_58,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&bStack_58);
  }
  return bVar1;
}

Assistant:

ExpressionLhs<bool> operator->* ( bool value ) {
        return ExpressionLhs<bool>( value );
    }